

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  char *pcVar1;
  char cVar2;
  const_pointer pcVar3;
  ulong uVar4;
  RuneRange RVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  ParseStatus PVar9;
  int iVar10;
  Regexp *this_00;
  CharClassBuilder *pCVar11;
  UGroup *g;
  ParseFlags parse_flags;
  size_type sVar12;
  long lVar13;
  size_type sVar14;
  Rune RVar15;
  Rune RVar16;
  RuneRange rr;
  Rune r;
  StringPiece whole_class;
  
  whole_class.data_ = s->data_;
  whole_class.size_ = s->size_;
  if ((s->size_ == 0) || (*s->data_ != '[')) {
    status->code_ = kRegexpInternalError;
    (status->error_arg_).data_ = (const_pointer)0x0;
    (status->error_arg_).size_ = 0;
  }
  else {
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpCharClass,
           this->flags_ &
           (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|Latin1|
            OneLine|MatchNL|Literal));
    pCVar11 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(pCVar11);
    (this_00->field_7).field_3.ccb_ = pCVar11;
    pcVar3 = s->data_;
    sVar14 = s->size_;
    pcVar1 = pcVar3 + 1;
    s->data_ = pcVar1;
    sVar12 = sVar14 - 1;
    s->size_ = sVar12;
    if ((sVar12 == 0) || (*pcVar1 != '^')) {
      bVar7 = false;
    }
    else {
      s->data_ = pcVar3 + 2;
      s->size_ = sVar14 - 2;
      bVar7 = true;
      if ((this->flags_ & (NeverNL|ClassNL)) != ClassNL) {
        CharClassBuilder::AddRange(pCVar11,10,10);
      }
    }
    bVar6 = 1;
    while (uVar4 = s->size_, uVar4 != 0) {
      RVar5 = (RuneRange)s->data_;
      cVar2 = *(char *)RVar5;
      if ((bool)(~bVar6 & cVar2 == ']')) {
        s->data_ = (char *)((long)RVar5 + 1);
        s->size_ = uVar4 - 1;
        if (bVar7) {
          CharClassBuilder::Negate((this_00->field_7).field_3.ccb_);
        }
        *out_re = this_00;
        return true;
      }
      if (!(bool)(bVar6 | cVar2 != '-')) {
        if (((this->flags_ & PerlX) != NoParseFlags) ||
           ((uVar4 != 1 && (*(char *)((long)RVar5 + 1) == ']')))) goto LAB_001b5849;
        rr = (RuneRange)((long)s->data_ + 1);
        iVar10 = StringPieceToRune(&r,(StringPiece *)&rr,status);
        if (-1 < iVar10) {
          status->code_ = kRegexpBadCharRange;
          (status->error_arg_).data_ = s->data_;
          (status->error_arg_).size_ = (ulong)(iVar10 + 1);
        }
        goto LAB_001b59a8;
      }
      if (((cVar2 == '[' && 2 < uVar4) && (*(char *)((long)RVar5 + 1) == ':')) && (1 < (long)uVar4))
      {
        parse_flags = this->flags_;
        pCVar11 = (this_00->field_7).field_3.ccb_;
        for (lVar13 = 2; (char *)((long)RVar5 + lVar13) <= (char *)((long)RVar5 + uVar4) + -2;
            lVar13 = lVar13 + 1) {
          if ((*(char *)((long)RVar5 + lVar13) == ':') &&
             (((char *)((long)RVar5 + 1))[lVar13] == ']')) {
            sVar14 = lVar13 + 2;
            rr = RVar5;
            g = LookupGroup((StringPiece *)&rr,(UGroup *)posix_groups,0x1c);
            if (g != (UGroup *)0x0) {
              s->data_ = s->data_ + sVar14;
              s->size_ = s->size_ - sVar14;
              iVar10 = g->sign;
              goto LAB_001b5868;
            }
            status->code_ = kRegexpBadCharRange;
            RVar15 = rr.lo;
            RVar16 = rr.hi;
            goto LAB_001b5940;
          }
        }
      }
      if ((cVar2 != '\\' || uVar4 < 3) || ((*(byte *)((long)RVar5 + 1) | 0x20) != 0x70))
      goto LAB_001b5849;
      PVar9 = ParseUnicodeGroup(s,this->flags_,(this_00->field_7).field_3.ccb_,status);
      bVar6 = 0;
      if (PVar9 != kParseOk) {
        if (PVar9 == kParseError) goto LAB_001b59a8;
LAB_001b5849:
        g = MaybeParsePerlCCEscape(s,this->flags_);
        if (g == (UGroup *)0x0) {
          rr.lo = 0;
          rr.hi = 0;
          bVar8 = ParseCCRange(this,s,&rr,&whole_class,status);
          if (!bVar8) goto LAB_001b59a8;
          CharClassBuilder::AddRangeFlags
                    ((this_00->field_7).field_3.ccb_,rr.lo,rr.hi,this->flags_ | ClassNL);
          bVar6 = 0;
        }
        else {
          pCVar11 = (this_00->field_7).field_3.ccb_;
          iVar10 = g->sign;
          parse_flags = this->flags_;
LAB_001b5868:
          AddUGroup(pCVar11,g,iVar10,parse_flags);
          bVar6 = 0;
        }
      }
    }
    status->code_ = kRegexpMissingBracket;
    RVar15 = (Rune)whole_class.data_;
    RVar16 = whole_class.data_._4_4_;
    sVar14 = whole_class.size_;
LAB_001b5940:
    *(Rune *)&(status->error_arg_).data_ = RVar15;
    *(Rune *)((long)&(status->error_arg_).data_ + 4) = RVar16;
    (status->error_arg_).size_ = sVar14;
LAB_001b59a8:
    Decref(this_00);
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->size() == 0 || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (s->size() > 0 && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (s->size() > 0 && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}